

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Value * soul::AST::TypeMetaFunction::performOp(Value *__return_storage_ptr__,Op op,Type *sourceType)

{
  Category CVar1;
  bool v;
  
  if (op == size) {
    CVar1 = sourceType->category & ~primitive;
    if ((CVar1 != vector) && (CVar1 != wrap)) {
      throwInternalCompilerError("isArrayOrVector()","getArrayOrVectorSize",0x137);
    }
    soul::Value::Value(__return_storage_ptr__,(long)sourceType->boundingSize);
  }
  else {
    v = performBoolOp(op,sourceType);
    soul::Value::Value(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value performOp (Op op, const Type& sourceType)
        {
            if (op == Op::size)
                return Value::createInt64 (sourceType.isBoundedInt() ? (uint64_t) sourceType.getBoundedIntLimit()
                                                                     : (uint64_t) sourceType.getArrayOrVectorSize());

            return Value (performBoolOp (op, sourceType));
        }